

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AddSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  bool bVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string srcFiles;
  undefined1 local_98 [40];
  undefined1 local_70 [32];
  string local_50;
  
  local_70._0_8_ = local_98 + 0x38;
  local_70._8_8_ = (_Elt_pointer)0x0;
  local_70[0x10] = 0;
  pbVar2 = (srcs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98._32_8_ =
       (srcs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar2 == (pointer)local_98._32_8_) {
      if ((_Elt_pointer)local_70._8_8_ != (_Elt_pointer)0x0) {
        cmMakefile::GetBacktrace((cmMakefile *)local_98);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &((this->Internal).Pointer)->SourceEntries,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_98 + 0x28));
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                  (&((this->Internal).Pointer)->SourceBacktraces,(value_type *)local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      }
      break;
    }
    std::__cxx11::string::string((string *)local_98,(string *)pbVar2);
    if ((ulong)local_98._8_8_ < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001a18f6;
LAB_001a191f:
      cmMakefile::GetOrCreateSource(this->Makefile,(string *)local_98,false,Ambiguous);
LAB_001a1932:
      std::__cxx11::string::append(local_98 + 0x28);
      bVar1 = true;
      std::__cxx11::string::append((string *)(local_98 + 0x28));
    }
    else {
      if ((*(char *)local_98._0_8_ == '$') && (*(char *)(local_98._0_8_ + 1) == '<'))
      goto LAB_001a1932;
LAB_001a18f6:
      ProcessSourceItemCMP0049(&local_50,this,(string *)local_98);
      std::__cxx11::string::operator=((string *)local_98,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001a191f;
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_98);
    pbVar2 = pbVar2 + 1;
  } while (bVar1);
  std::__cxx11::string::~string((string *)(local_98 + 0x28));
  return;
}

Assistant:

void cmTarget::AddSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles;
  const char* sep = "";
  for (auto filename : srcs) {
    if (!cmGeneratorExpression::StartsWithGeneratorExpression(filename)) {
      if (!filename.empty()) {
        filename = this->ProcessSourceItemCMP0049(filename);
        if (filename.empty()) {
          return;
        }
      }
      this->Makefile->GetOrCreateSource(filename);
    }
    srcFiles += sep;
    srcFiles += filename;
    sep = ";";
  }
  if (!srcFiles.empty()) {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(std::move(srcFiles));
    this->Internal->SourceBacktraces.push_back(lfbt);
  }
}